

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

char * google::protobuf::FastUInt64ToBufferLeft(uint64 u64,char *buffer)

{
  uint uVar1;
  char *pcVar2;
  long lVar3;
  char *in_RDX;
  uint64 in_RSI;
  ulong in_RDI;
  uint64 top_11_digits;
  uint32 u;
  char *ASCII_digits;
  int digits;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  char *local_8;
  
  if ((in_RDI & 0xffffffff) == in_RDI) {
    local_8 = FastUInt32ToBufferLeft((protobuf *)(in_RDI & 0xffffffff),(uint32)in_RSI,in_RDX);
  }
  else {
    pcVar2 = FastUInt64ToBufferLeft
                       (in_RSI,(char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)
                       );
    uVar1 = (int)in_RDI + (int)(in_RDI / 1000000000) * -1000000000;
    lVar3 = (long)(int)(uVar1 / 10000000) * 2;
    *pcVar2 = two_ASCII_digits[lVar3];
    pcVar2[1] = two_ASCII_digits[lVar3 + 1];
    uVar1 = uVar1 % 10000000;
    lVar3 = (long)(int)(uVar1 / 100000) * 2;
    pcVar2[2] = two_ASCII_digits[lVar3];
    pcVar2[3] = two_ASCII_digits[lVar3 + 1];
    uVar1 = uVar1 % 100000;
    lVar3 = (long)(int)(uVar1 / 1000) * 2;
    pcVar2[4] = two_ASCII_digits[lVar3];
    pcVar2[5] = two_ASCII_digits[lVar3 + 1];
    uVar1 = uVar1 % 1000;
    lVar3 = (long)(int)(uVar1 / 10) * 2;
    pcVar2[6] = two_ASCII_digits[lVar3];
    pcVar2[7] = two_ASCII_digits[lVar3 + 1];
    local_8 = pcVar2 + 9;
    pcVar2[8] = (char)(uVar1 % 10) + '0';
    *local_8 = '\0';
  }
  return local_8;
}

Assistant:

char* FastUInt64ToBufferLeft(uint64 u64, char* buffer) {
  int digits;
  const char *ASCII_digits = nullptr;

  uint32 u = static_cast<uint32>(u64);
  if (u == u64) return FastUInt32ToBufferLeft(u, buffer);

  uint64 top_11_digits = u64 / 1000000000;
  buffer = FastUInt64ToBufferLeft(top_11_digits, buffer);
  u = u64 - (top_11_digits * 1000000000);

  digits = u / 10000000;  // 10,000,000
  GOOGLE_DCHECK_LT(digits, 100);
  ASCII_digits = two_ASCII_digits[digits];
  buffer[0] = ASCII_digits[0];
  buffer[1] = ASCII_digits[1];
  buffer += 2;
  u -= digits * 10000000;  // 10,000,000
  digits = u / 100000;  // 100,000
  ASCII_digits = two_ASCII_digits[digits];
  buffer[0] = ASCII_digits[0];
  buffer[1] = ASCII_digits[1];
  buffer += 2;
  u -= digits * 100000;  // 100,000
  digits = u / 1000;  // 1,000
  ASCII_digits = two_ASCII_digits[digits];
  buffer[0] = ASCII_digits[0];
  buffer[1] = ASCII_digits[1];
  buffer += 2;
  u -= digits * 1000;  // 1,000
  digits = u / 10;
  ASCII_digits = two_ASCII_digits[digits];
  buffer[0] = ASCII_digits[0];
  buffer[1] = ASCII_digits[1];
  buffer += 2;
  u -= digits * 10;
  digits = u;
  *buffer++ = '0' + digits;
  *buffer = 0;
  return buffer;
}